

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dec_sse2.c
# Opt level: O1

void SimpleVFilter16_SSE2(uint8_t *p,int stride,int thresh)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte bVar4;
  byte bVar5;
  byte bVar6;
  byte bVar7;
  byte bVar8;
  byte bVar9;
  byte bVar10;
  byte bVar11;
  byte bVar12;
  byte bVar13;
  byte bVar14;
  byte bVar15;
  byte bVar16;
  long lVar17;
  undefined1 uVar20;
  undefined1 uVar21;
  undefined1 uVar22;
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  undefined1 auVar23 [16];
  byte bVar24;
  byte bVar32;
  byte bVar33;
  byte bVar34;
  undefined1 auVar25 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  
  lVar17 = (long)stride;
  auVar23 = *(undefined1 (*) [16])(p + lVar17 * -2);
  auVar46 = *(undefined1 (*) [16])(p + lVar17);
  uVar22 = (undefined1)((uint)thresh >> 0x18);
  uVar21 = (undefined1)((uint)thresh >> 0x10);
  uVar20 = (undefined1)((uint)thresh >> 8);
  auVar19._4_4_ =
       (int)(CONCAT35(CONCAT21(CONCAT11(uVar22,uVar22),uVar21),CONCAT14(uVar21,thresh)) >> 0x20);
  auVar19[3] = uVar20;
  auVar19[2] = uVar20;
  auVar19[0] = (undefined1)thresh;
  auVar19[1] = auVar19[0];
  auVar19._8_8_ = 0;
  auVar18 = pshuflw(auVar19,auVar19,0);
  auVar19 = psubusb(auVar46,auVar23);
  auVar36 = psubusb(auVar23,auVar46);
  auVar36 = auVar36 | auVar19;
  auVar37._0_2_ = auVar36._0_2_ >> 1;
  auVar37._2_2_ = auVar36._2_2_ >> 1;
  auVar37._4_2_ = auVar36._4_2_ >> 1;
  auVar37._6_2_ = auVar36._6_2_ >> 1;
  auVar37._8_2_ = auVar36._8_2_ >> 1;
  auVar37._10_2_ = auVar36._10_2_ >> 1;
  auVar37._12_2_ = auVar36._12_2_ >> 1;
  auVar37._14_2_ = auVar36._14_2_ >> 1;
  auVar19 = *(undefined1 (*) [16])p;
  auVar36 = *(undefined1 (*) [16])(p + -lVar17);
  auVar35 = psubusb(auVar19,auVar36);
  auVar47 = psubusb(auVar36,auVar19);
  auVar35 = paddusb(auVar47 | auVar35,auVar47 | auVar35);
  auVar35 = paddusb(auVar37 & _DAT_0018acb0,auVar35);
  auVar23 = psubsb(auVar23 ^ _DAT_00189d30,auVar46 ^ _DAT_00189d30);
  auVar46 = psubsb(auVar19 ^ _DAT_00189d30,auVar36 ^ _DAT_00189d30);
  auVar23 = paddsb(auVar23,auVar46);
  auVar23 = paddsb(auVar23,auVar46);
  auVar23 = paddsb(auVar23,auVar46);
  bVar1 = auVar35[0];
  bVar24 = auVar18[0];
  bVar2 = auVar35[1];
  bVar32 = auVar18[1];
  bVar3 = auVar35[2];
  bVar33 = auVar18[2];
  bVar4 = auVar35[3];
  bVar34 = auVar18[3];
  bVar5 = auVar35[4];
  bVar6 = auVar35[5];
  bVar7 = auVar35[6];
  bVar8 = auVar35[7];
  bVar9 = auVar35[8];
  bVar10 = auVar35[9];
  bVar11 = auVar35[10];
  bVar12 = auVar35[0xb];
  bVar13 = auVar35[0xc];
  bVar14 = auVar35[0xd];
  bVar15 = auVar35[0xe];
  bVar16 = auVar35[0xf];
  auVar18[0] = -((byte)((bVar1 < bVar24) * bVar1 | (bVar1 >= bVar24) * bVar24) == bVar1);
  auVar18[1] = -((byte)((bVar2 < bVar32) * bVar2 | (bVar2 >= bVar32) * bVar32) == bVar2);
  auVar18[2] = -((byte)((bVar3 < bVar33) * bVar3 | (bVar3 >= bVar33) * bVar33) == bVar3);
  auVar18[3] = -((byte)((bVar4 < bVar34) * bVar4 | (bVar4 >= bVar34) * bVar34) == bVar4);
  auVar18[4] = -((byte)((bVar5 < bVar24) * bVar5 | (bVar5 >= bVar24) * bVar24) == bVar5);
  auVar18[5] = -((byte)((bVar6 < bVar32) * bVar6 | (bVar6 >= bVar32) * bVar32) == bVar6);
  auVar18[6] = -((byte)((bVar7 < bVar33) * bVar7 | (bVar7 >= bVar33) * bVar33) == bVar7);
  auVar18[7] = -((byte)((bVar8 < bVar34) * bVar8 | (bVar8 >= bVar34) * bVar34) == bVar8);
  auVar18[8] = -((byte)((bVar9 < bVar24) * bVar9 | (bVar9 >= bVar24) * bVar24) == bVar9);
  auVar18[9] = -((byte)((bVar10 < bVar32) * bVar10 | (bVar10 >= bVar32) * bVar32) == bVar10);
  auVar18[10] = -((byte)((bVar11 < bVar33) * bVar11 | (bVar11 >= bVar33) * bVar33) == bVar11);
  auVar18[0xb] = -((byte)((bVar12 < bVar34) * bVar12 | (bVar12 >= bVar34) * bVar34) == bVar12);
  auVar18[0xc] = -((byte)((bVar13 < bVar24) * bVar13 | (bVar13 >= bVar24) * bVar24) == bVar13);
  auVar18[0xd] = -((byte)((bVar14 < bVar32) * bVar14 | (bVar14 >= bVar32) * bVar32) == bVar14);
  auVar18[0xe] = -((byte)((bVar15 < bVar33) * bVar15 | (bVar15 >= bVar33) * bVar33) == bVar15);
  auVar18[0xf] = -((byte)((bVar16 < bVar34) * bVar16 | (bVar16 >= bVar34) * bVar34) == bVar16);
  auVar46 = paddsb(_DAT_0018acc0,auVar18 & auVar23);
  auVar23 = paddsb(auVar18 & auVar23,_DAT_0018acd0);
  auVar45._0_14_ = auVar35._0_14_;
  auVar45[0xe] = bVar8;
  auVar45[0xf] = auVar23[7];
  auVar44._14_2_ = auVar45._14_2_;
  auVar44._0_13_ = auVar35._0_13_;
  auVar44[0xd] = auVar23[6];
  auVar43._13_3_ = auVar44._13_3_;
  auVar43._0_12_ = auVar35._0_12_;
  auVar43[0xc] = bVar7;
  auVar42._12_4_ = auVar43._12_4_;
  auVar42._0_11_ = auVar35._0_11_;
  auVar42[0xb] = auVar23[5];
  auVar41._11_5_ = auVar42._11_5_;
  auVar41._0_10_ = auVar35._0_10_;
  auVar41[10] = bVar6;
  auVar40._10_6_ = auVar41._10_6_;
  auVar40._0_9_ = auVar35._0_9_;
  auVar40[9] = auVar23[4];
  auVar39._9_7_ = auVar40._9_7_;
  auVar39._0_8_ = auVar35._0_8_;
  auVar39[8] = bVar5;
  auVar38._8_8_ = auVar39._8_8_;
  auVar38[7] = auVar23[3];
  auVar38[6] = bVar4;
  auVar38[5] = auVar23[2];
  auVar38[4] = bVar3;
  auVar38[3] = auVar23[1];
  auVar38[2] = bVar2;
  auVar38[1] = auVar23[0];
  auVar38[0] = bVar1;
  auVar35[1] = auVar23[8];
  auVar35[0] = auVar23[8];
  auVar35[2] = auVar23[9];
  auVar35[3] = auVar23[9];
  auVar35[4] = auVar23[10];
  auVar35[5] = auVar23[10];
  auVar35[6] = auVar23[0xb];
  auVar35[7] = auVar23[0xb];
  auVar35[8] = auVar23[0xc];
  auVar35[9] = auVar23[0xc];
  auVar35[10] = auVar23[0xd];
  auVar35[0xb] = auVar23[0xd];
  auVar35[0xc] = auVar23[0xe];
  auVar35[0xd] = auVar23[0xe];
  auVar35[0xf] = auVar23[0xf];
  auVar35[0xe] = auVar35[0xf];
  auVar18 = psraw(auVar38,0xb);
  auVar23 = psraw(auVar35,0xb);
  auVar18 = packsswb(auVar18,auVar23);
  auVar47._0_14_ = auVar23._0_14_;
  auVar47[0xe] = auVar23[7];
  auVar47[0xf] = auVar46[7];
  auVar31._14_2_ = auVar47._14_2_;
  auVar31._0_13_ = auVar23._0_13_;
  auVar31[0xd] = auVar46[6];
  auVar30._13_3_ = auVar31._13_3_;
  auVar30._0_12_ = auVar23._0_12_;
  auVar30[0xc] = auVar23[6];
  auVar29._12_4_ = auVar30._12_4_;
  auVar29._0_11_ = auVar23._0_11_;
  auVar29[0xb] = auVar46[5];
  auVar28._11_5_ = auVar29._11_5_;
  auVar28._0_10_ = auVar23._0_10_;
  auVar28[10] = auVar23[5];
  auVar27._10_6_ = auVar28._10_6_;
  auVar27._0_9_ = auVar23._0_9_;
  auVar27[9] = auVar46[4];
  auVar26._9_7_ = auVar27._9_7_;
  auVar26._0_8_ = auVar23._0_8_;
  auVar26[8] = auVar23[4];
  auVar25._8_8_ = auVar26._8_8_;
  auVar25[7] = auVar46[3];
  auVar25[6] = auVar23[3];
  auVar25[5] = auVar46[2];
  auVar25[4] = auVar23[2];
  auVar25[3] = auVar46[1];
  auVar25[2] = auVar23[1];
  auVar25[0] = auVar23[0];
  auVar25[1] = auVar46[0];
  auVar23[1] = auVar46[8];
  auVar23[0] = auVar46[8];
  auVar23[2] = auVar46[9];
  auVar23[3] = auVar46[9];
  auVar23[4] = auVar46[10];
  auVar23[5] = auVar46[10];
  auVar23[6] = auVar46[0xb];
  auVar23[7] = auVar46[0xb];
  auVar23[8] = auVar46[0xc];
  auVar23[9] = auVar46[0xc];
  auVar23[10] = auVar46[0xd];
  auVar23[0xb] = auVar46[0xd];
  auVar23[0xc] = auVar46[0xe];
  auVar23[0xd] = auVar46[0xe];
  auVar23[0xf] = auVar46[0xf];
  auVar23[0xe] = auVar23[0xf];
  auVar46 = psraw(auVar25,0xb);
  auVar23 = psraw(auVar23,0xb);
  auVar46 = packsswb(auVar46,auVar23);
  auVar23 = psubsb(auVar19 ^ _DAT_00189d30,auVar18);
  auVar46 = paddsb(auVar46,auVar36 ^ _DAT_00189d30);
  auVar23 = auVar23 ^ _DAT_00189d30;
  *(undefined1 (*) [16])(p + -lVar17) = auVar46 ^ _DAT_00189d30;
  *(undefined1 (*) [16])p = auVar23;
  return;
}

Assistant:

static void SimpleVFilter16_SSE2(uint8_t* p, int stride, int thresh) {
  // Load
  __m128i p1 = _mm_loadu_si128((__m128i*)&p[-2 * stride]);
  __m128i p0 = _mm_loadu_si128((__m128i*)&p[-stride]);
  __m128i q0 = _mm_loadu_si128((__m128i*)&p[0]);
  __m128i q1 = _mm_loadu_si128((__m128i*)&p[stride]);

  DoFilter2_SSE2(&p1, &p0, &q0, &q1, thresh);

  // Store
  _mm_storeu_si128((__m128i*)&p[-stride], p0);
  _mm_storeu_si128((__m128i*)&p[0], q0);
}